

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZGeoBlend<pzgeom::TPZGeoLinear> *cp,
          TPZGeoMesh *destmesh)

{
  int64_t iVar1;
  long lVar2;
  TPZGeoEl *pTVar3;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016c8798;
  iVar1 = (cp->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1];
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0] =
       (cp->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0];
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c42a0;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x30);
  this_00 = (TPZTransform<double> *)&this->field_0x50;
  TPZTransform<double>::TPZTransform(this_00);
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x1f0);
  iVar1 = cp->fGeoEl->fIndex;
  t = (TPZTransform<double> *)&cp->field_0x50;
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar2);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar2);
    TPZTransform<double>::operator=(this_00,t);
    t = t + 1;
    this_00 = this_00 + 1;
  }
  pTVar3 = TPZGeoMesh::Element(destmesh,iVar1);
  this->fGeoEl = pTVar3;
  if (pTVar3 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1d);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}